

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O3

offset_type __thiscall foxxll::ufs_file_base::_size(ufs_file_base *this)

{
  offset_type oVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  io_error *this_00;
  ostringstream msg;
  string sStack_1a8;
  ostringstream local_188 [376];
  
  oVar1 = lseek64(this->file_des_,0,2);
  if (-1 < (long)oVar1) {
    return oVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"Error in ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"file::offset_type foxxll::ufs_file_base::_size()",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188," : ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"lseek(fd,0,SEEK_END) path=",0x1a);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_188,(this->filename_)._M_dataplus._M_p,
                      (this->filename_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," fd=",4);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->file_des_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  std::operator<<(poVar2,pcVar4);
  this_00 = (io_error *)__cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  io_error::io_error(this_00,&sStack_1a8);
  __cxa_throw(this_00,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

file::offset_type ufs_file_base::_size()
{
    // We use lseek SEEK_END to find the file size. This works for raw devices
    // (where stat() returns zero), and we need not reset the position because
    // serve() always lseek()s before read/write.

    off_t rc = ::lseek(file_des_, 0, SEEK_END);
    if (rc < 0)
        FOXXLL_THROW_ERRNO(io_error, "lseek(fd,0,SEEK_END) path=" << filename_ << " fd=" << file_des_);

    // return value is already the total size
    return rc;
}